

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-group.c
# Opt level: O0

void monster_group_remove_leader(chunk *c,monster *leader,monster_group_conflict *group)

{
  _Bool _Var1;
  monster_conflict *pmVar2;
  monster *mon_1;
  monster *mon;
  mon_group_list_entry_conflict *pmStack_28;
  wchar_t poss_leader;
  mon_group_list_entry_conflict *list_entry;
  monster_group_conflict *group_local;
  monster *leader_local;
  chunk *c_local;
  
  pmStack_28 = group->member_list;
  mon._4_4_ = L'\0';
  while (pmStack_28 != (mon_group_list_entry_conflict *)0x0) {
    pmVar2 = cave_monster((chunk_conflict *)c,pmStack_28->midx);
    if (pmVar2 == (monster_conflict *)0x0) {
      pmStack_28 = pmStack_28->next;
    }
    else {
      if (((leader->race == pmVar2->race) && (mon._4_4_ == L'\0')) &&
         (pmVar2->group_info[0].role != MON_GROUP_SUMMON)) {
        mon._4_4_ = pmVar2->midx;
      }
      _Var1 = monster_is_unique((monster *)pmVar2);
      if (_Var1) {
        mon._4_4_ = pmVar2->midx;
      }
      pmStack_28 = pmStack_28->next;
    }
  }
  if (mon._4_4_ == L'\0') {
    monster_group_split(c,group,leader);
    c->monster_groups[group->index] = (monster_group_conflict *)0x0;
    monster_group_free(c,group);
  }
  else {
    group->leader = mon._4_4_;
    pmStack_28 = group->member_list;
    if (pmStack_28 == (mon_group_list_entry_conflict *)0x0) {
      __assert_fail("list_entry",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-group.c"
                    ,0x85,
                    "void monster_group_remove_leader(struct chunk *, struct monster *, struct monster_group *)"
                   );
    }
    for (; pmStack_28 != (mon_group_list_entry_conflict *)0x0; pmStack_28 = pmStack_28->next) {
      pmVar2 = cave_monster((chunk_conflict *)c,pmStack_28->midx);
      if (pmVar2->midx == mon._4_4_) {
        pmVar2->group_info[0].role = MON_GROUP_LEADER;
        break;
      }
    }
  }
  monster_groups_verify(c);
  return;
}

Assistant:

static void monster_group_remove_leader(struct chunk *c, struct monster *leader,
										struct monster_group *group)
{
	struct mon_group_list_entry *list_entry = group->member_list;
	int poss_leader = 0;

	/* Look for another leader */
	while (list_entry) {
		struct monster *mon = cave_monster(c, list_entry->midx);

		if (!mon) {
			list_entry = list_entry->next;
			continue;
		}

		/* Monsters of the same race can take over as leader */
		if ((leader->race == mon->race) && !poss_leader
			&& (mon->group_info[PRIMARY_GROUP].role != MON_GROUP_SUMMON)) {
			poss_leader = mon->midx;
		}

		/* Uniques always take over */
		if (monster_is_unique(mon)) {
			poss_leader = mon->midx;
		}
		list_entry = list_entry->next;
	}

	/* If no new leader, group fractures and old group is removed */
	if (!poss_leader) {
		monster_group_split(c, group, leader);
		c->monster_groups[group->index] = NULL;
		monster_group_free(c, group);
	} else {
		/* If there is a successor, appoint them and finalise changes */
		group->leader = poss_leader;
		list_entry = group->member_list;
		assert(list_entry);
		while (list_entry) {
			struct monster *mon = cave_monster(c, list_entry->midx);

			/* Record the leader */
			if (mon->midx == poss_leader) {
				mon->group_info[PRIMARY_GROUP].role = MON_GROUP_LEADER;
				break;
			}
			list_entry = list_entry->next;
		}
	}
	monster_groups_verify(c);
}